

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.cpp
# Opt level: O0

char __thiscall configFileReader::getNextChar(configFileReader *this)

{
  typeOfSeparator tVar1;
  char local_11;
  char out;
  configFileReader *this_local;
  
  if ((this->readFromString & 1U) == 0) {
    openFile(this);
    local_11 = std::istream::get();
  }
  else {
    local_11 = peekNextChar(this);
    this->index = this->index + 1;
  }
  tVar1 = isSeparator(this,local_11);
  if (tVar1 == space) {
    local_11 = ' ';
  }
  return local_11;
}

Assistant:

char configFileReader::getNextChar() {
    char out;
    if (readFromString) {
        out = peekNextChar();
        index++;
    } else {
        openFile();
        out = (char) configFile->get();
    }
    if (isSeparator(out) == typeOfSeparator::space)
        out = ' ';

    return out;
}